

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O2

uint RemSP::Merge(uint i,uint j)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  uint uVar4;
  uint root_j;
  uint root_i;
  bool bVar5;
  
  puVar2 = P_;
  uVar3 = (ulong)j;
  do {
    while( true ) {
      uVar4 = puVar2[i];
      uVar1 = puVar2[uVar3];
      if (uVar4 == uVar1) {
        return uVar4;
      }
      if (uVar1 < uVar4) break;
      puVar2[uVar3] = uVar4;
      uVar4 = (uint)uVar3;
      uVar3 = (ulong)uVar1;
      if (uVar4 == uVar1) {
        return puVar2[i];
      }
    }
    puVar2[i] = uVar1;
    bVar5 = i != uVar4;
    i = uVar4;
  } while (bVar5);
  return uVar1;
}

Assistant:

static unsigned Merge(unsigned i, unsigned j)
    {
        unsigned root_i(i), root_j(j);

        while (P_[root_i] != P_[root_j]) {
            if (P_[root_i] > P_[root_j]) {
                if (root_i == P_[root_i]) {
                    P_[root_i] = P_[root_j];
                    return P_[root_i];
                }
                unsigned z = P_[root_i];
                P_[root_i] = P_[root_j];
                root_i = z;
            }
            else {
                if (root_j == P_[root_j]) {
                    P_[root_j] = P_[root_i];
                    return P_[root_i];
                }
                unsigned z = P_[root_j];
                P_[root_j] = P_[root_i];
                root_j = z;
            }
        }
        return P_[root_i];
    }